

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int *piVar2;
  size_t i;
  ulong uVar3;
  pointer pdVar4;
  initializer_list<double> __l;
  allocator_type local_61;
  vector<double,_std::allocator<double>_> criteria;
  double local_48 [5];
  
  local_48[2] = 4.0;
  local_48[3] = 2.0;
  local_48[0] = 8.0;
  local_48[1] = 5.0;
  __l._M_len = 4;
  __l._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::vector(&criteria,__l,&local_61);
  piVar2 = &DAT_001059f8;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)criteria.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)criteria.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    if (uVar3 < 4) {
      std::operator<<((ostream *)&std::cout,(char *)((long)&DAT_001059f8 + (long)*piVar2));
    }
    poVar1 = std::ostream::_M_insert<double>
                       (criteria.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3]);
    std::endl<char,std::char_traits<char>>(poVar1);
    piVar2 = piVar2 + 1;
  }
  normalize(&criteria);
  std::operator<<((ostream *)&std::cout,"Normalized vector { ");
  for (pdVar4 = criteria.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 != criteria.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
    poVar1 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar1," ");
  }
  std::operator<<((ostream *)&std::cout,"}\n");
  setMarks();
  std::operator<<((ostream *)&std::cout,"\n\n\nReplacing criteria with restrictions\n");
  criteria_change();
  std::operator<<((ostream *)&std::cout,"\n\n\nFormation and narrowing of the Parreto set\n");
  Pareto();
  std::operator<<((ostream *)&std::cout,"\n\n\nWeighting and combining criteria\n");
  Enum();
  std::operator<<((ostream *)&std::cout,"\n\n\nHeirarchies\n");
  Hierarchies();
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&criteria.super__Vector_base<double,_std::allocator<double>_>);
  return 0;
}

Assistant:

int main() {
    vector<double> criteria={8,5,4,2};
    for(size_t i=0;i<criteria.size();i++){
        if(i==0)
            cout << "Cost: ";
        if(i==1)
            cout << "Expenses for service: ";
        if(i==2)
            cout << "Gas consumption: ";
        if(i==3)
            cout << "Comfort: ";
        cout << criteria[i] << endl;
    }
    normalize(criteria);
    cout << "Normalized vector { ";
    for(const double &i : criteria)
        cout << setprecision(3) << i << " ";

    cout << "}\n";

    setMarks();

    cout << "\n\n\nReplacing criteria with restrictions\n";
    criteria_change();

    cout << "\n\n\nFormation and narrowing of the Parreto set\n";
    Pareto();

    cout << "\n\n\nWeighting and combining criteria\n";
    Enum();

    cout << "\n\n\nHeirarchies\n";
    Hierarchies();
}